

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlaterIntegrals.hpp
# Opt level: O2

RealType sSTOCoulInt(RealType a,RealType b,int m,int n,RealType R)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int p_1;
  int iVar4;
  int p_00;
  int iVar5;
  long lVar6;
  int p;
  int iVar7;
  int n_00;
  int iVar8;
  RealType *pRVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  RealType RVar16;
  double dVar17;
  RealType RVar18;
  RealType RVar19;
  double dVar20;
  double dVar21;
  double local_d8;
  double local_c0;
  int local_b8;
  
  dVar21 = a + a;
  dVar11 = dVar21 * R;
  if (ABS(dVar11) < 2.220446049250313e-16) {
    uVar1 = m * 2;
    iVar2 = m * 2 + -1;
    pRVar9 = fact;
    dVar11 = fact[iVar2];
    dVar12 = pow(dVar21,(double)(int)uVar1);
    iVar4 = n * 2;
    local_d8 = 0.0;
    iVar5 = iVar4;
    for (lVar6 = 1; lVar6 <= iVar4; lVar6 = lVar6 + 1) {
      dVar13 = pow(b + b,(double)(iVar5 + -1));
      dVar15 = pRVar9[(long)((m + n) * 2) + -2];
      dVar20 = pRVar9[(long)iVar4 + -1];
      dVar14 = pow(a + b + a + b,(double)(iVar5 + iVar2));
      local_d8 = local_d8 +
                 (dVar13 * (double)(int)lVar6 * dVar15) / (dVar14 * (dVar20 + dVar20) * (double)n);
      pRVar9 = pRVar9 + -1;
      iVar5 = iVar5 + -1;
    }
    dVar21 = pow(dVar21,(double)(int)(uVar1 | 1));
    RVar18 = ((dVar11 / dVar12 - local_d8) * dVar21) / fact[(int)uVar1];
  }
  else {
    iVar4 = m * 2;
    dVar20 = (double)iVar4;
    dVar12 = pow(dVar11,dVar20);
    dVar21 = fact[iVar4];
    iVar5 = m * 2 + -1;
    RVar18 = RosenA(iVar5,dVar11);
    dVar15 = exp(-dVar11);
    dVar13 = (RVar18 * (dVar11 - dVar20) - dVar15) * (dVar12 / (dVar21 * R)) + 1.0 / R + 0.0;
    dVar12 = 0.0 / dVar13;
    dVar15 = pow(a * R,dVar20);
    dVar20 = (double)n;
    if ((a != b) || (NAN(a) || NAN(b))) {
      if ((b != 0.0) || (NAN(b))) {
        dVar21 = (-a * dVar15) / ((dVar20 + dVar20) * dVar21);
        uVar1 = n * 2;
        uVar10 = 0;
        uVar3 = 0;
        if (0 < (int)uVar1) {
          uVar3 = (ulong)uVar1;
        }
        dVar11 = 0.0;
        iVar2 = iVar5;
        do {
          iVar7 = 0;
          if (0 < iVar4) {
            iVar7 = iVar4;
          }
          if (uVar10 == uVar3) break;
          dVar15 = 0.0;
          iVar8 = iVar2;
          for (p_00 = 0; n_00 = (int)uVar10, iVar7 != p_00; p_00 = p_00 + 1) {
            RVar18 = RosenD(iVar5,n_00,p_00);
            RVar16 = RosenB(p_00,(a - b) * R);
            RVar19 = RosenA(iVar8,(a + b) * R);
            dVar15 = dVar15 + RVar19 * RVar16 * RVar18;
            iVar8 = iVar8 + -1;
          }
          dVar20 = fact[uVar10];
          dVar14 = pow(b * R,(double)n_00);
          dVar14 = dVar14 * ((dVar15 * (double)(int)(uVar1 - n_00)) / dVar20);
          dVar11 = dVar11 + dVar14;
          uVar10 = uVar10 + 1;
          iVar4 = iVar4 + 1;
          iVar2 = iVar2 + 1;
        } while (dVar12 / ABS(dVar21) <= ABS(dVar14));
        dVar21 = dVar21 * dVar11;
      }
      else {
        puts("WARNING: b = 0 in sSTOCoulInt");
        dVar21 = 0.0;
      }
    }
    else {
      dVar21 = (-a * dVar15) / (dVar21 * dVar20);
      uVar10 = 0;
      uVar3 = (ulong)(uint)(n * 2);
      if (n * 2 < 1) {
        uVar3 = uVar10;
      }
      local_c0 = 0.0;
      local_b8 = iVar5;
      for (; uVar10 != uVar3; uVar10 = uVar10 + 1) {
        iVar8 = (int)uVar10;
        dVar15 = fact[uVar10];
        dVar14 = pow(a * R,(double)iVar8);
        dVar14 = dVar14 * (((dVar20 + dVar20) - (double)iVar8) / dVar15);
        dVar15 = 0.0;
        iVar2 = 0;
        iVar4 = local_b8;
        for (iVar7 = 0; iVar7 <= (iVar8 + -1) / 2 + m; iVar7 = iVar7 + 1) {
          RVar18 = RosenD(iVar5,iVar8,iVar2);
          RVar16 = RosenA(iVar4,dVar11);
          dVar17 = RVar16 * (RVar18 / ((double)iVar7 + (double)iVar7 + 1.0));
          if ((0.0 < dVar17) && (dVar17 < dVar12 / ABS(dVar21 * dVar14))) goto LAB_0023bf58;
          dVar15 = dVar15 + dVar17;
          iVar4 = iVar4 + -2;
          iVar2 = iVar2 + 2;
        }
        local_c0 = local_c0 + dVar15 * dVar14;
        local_b8 = local_b8 + 1;
      }
LAB_0023bf58:
      dVar21 = dVar21 * local_c0;
    }
    RVar18 = dVar13 + dVar21;
  }
  return RVar18;
}

Assistant:

inline RealType sSTOCoulInt(RealType a, RealType b, int m, int n, RealType R) {
  RealType x, K2;
  RealType Factor1, Factor2, Term, OneElectronTerm;
  RealType eps, epsi;

  // To speed up calculation, we terminate loop once contributions
  // to integral fall below the bound, epsilon
  RealType epsilon = 0.;

  // x is the argument of the auxiliary RosenA and RosenB functions
  x = 2. * a * R;

  // First compute the two-electron component
  RealType sSTOCoulInt_ = 0.;
  if (std::fabs(x) <
      std::numeric_limits<RealType>::epsilon())  // Pathological case
  {
    // This solution for the one-center coulomb integrals comes from
    // Yoshiyuki Hase, Computers & Chemistry 9(4), pp. 285-287 (1985).

    RealType Term1 = fact[2 * m - 1] / pow(2 * a, 2 * m);
    RealType Term2 = 0.;
    for (int nu = 1; nu <= 2 * n; nu++) {
      Term2 += nu * pow(2 * b, 2 * n - nu) * fact[2 * (m + n) - nu - 1] /
               (fact[2 * n - nu] * 2 * n * pow(2 * (a + b), 2 * (m + n) - nu));
    }
    sSTOCoulInt_ = pow(2 * a, 2 * m + 1) * (Term1 - Term2) / fact[2 * m];

    // Original QTPIE code for the one-center case is below.  Doesn't
    // appear to generate the correct one-center results.
    //
    // if ((a==b) && (m==n))
    //   {
    //     for (int nu=0; nu<=2*n-1; nu++)
    //       {
    //         K2 = 0.;
    //         for (unsigned p=0; p<=2*n+m; p++) K2 += 1. / fact[p];
    //         sSTOCoulInt_ += K2 * fact[2*n+m] / fact[m];
    //       }
    //     sSTOCoulInt_ = 2 * a / (n * fact[2*n]) * sSTOCoulInt_;
    //   }
    // else
    //   {
    //     // Not implemented
    //     printf("ERROR, sSTOCoulInt cannot compute from arguments\n");
    //     printf("a = %lf b = %lf m = %d n = %d R = %lf\n",a, b, m, n, R);
    //     exit(0);
    //   }

  } else {
    OneElectronTerm = 1. / R +
                      pow(x, 2 * m) / (fact[2 * m] * R) *
                          ((x - 2 * m) * RosenA(2 * m - 1, x) - exp(-x)) +
                      sSTOCoulInt_;
    eps = epsilon / OneElectronTerm;
    if (a == b) {
      // Apply Rosen (48)
      Factor1 = -a * pow(a * R, 2 * m) / (n * fact[2 * m]);
      for (int nu = 0; nu <= 2 * n - 1; nu++) {
        Factor2 = (2. * n - nu) / fact[nu] * pow(a * R, nu);
        epsi    = eps / fabs(Factor1 * Factor2);
        K2      = 0.;
        for (int p = 0; p <= m + (nu - 1) / 2; p++) {
          Term = RosenD(2 * m - 1, nu, 2 * p) / (2. * p + 1.) *
                 RosenA(2 * m + nu - 1 - 2 * p, x);
          K2 += Term;
          if ((Term > 0) && (Term < epsi)) goto label1;
        }
        sSTOCoulInt_ += K2 * Factor2;
      }
    label1:
      sSTOCoulInt_ *= Factor1;
    } else {
      Factor1 = -a * pow(a * R, 2 * m) / (2. * n * fact[2 * m]);
      epsi    = eps / fabs(Factor1);
      if (b == 0.)
        printf("WARNING: b = 0 in sSTOCoulInt\n");
      else {
        // Apply Rosen (54)
        for (int nu = 0; nu <= 2 * n - 1; nu++) {
          K2 = 0;
          for (int p = 0; p <= 2 * m + nu - 1; p++)
            K2 = K2 + RosenD(2 * m - 1, nu, p) * RosenB(p, R * (a - b)) *
                          RosenA(2 * m + nu - 1 - p, R * (a + b));
          Term = K2 * (2 * n - nu) / fact[nu] * pow(b * R, nu);
          sSTOCoulInt_ += Term;
          if (fabs(Term) < epsi) goto label2;
        }
      label2:
        sSTOCoulInt_ *= Factor1;
      }
    }
    // Now add the one-electron term from Rosen (47) = Rosen (53)
    sSTOCoulInt_ += OneElectronTerm;
  }
  return sSTOCoulInt_;
}